

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

ARKRhsFn mriStep_GetImplicitRHS(void *arkode_mem)

{
  int iVar1;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  ARKRhsFn local_8;
  
  iVar1 = mriStep_AccessStepMem
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (ARKodeMRIStepMem *)0x1154614);
  if (iVar1 == 0) {
    if (*(int *)(in_stack_ffffffffffffffe0 + 0x1c) == 0) {
      local_8 = (ARKRhsFn)0x0;
    }
    else {
      local_8 = *(ARKRhsFn *)(in_stack_ffffffffffffffe0 + 8);
    }
  }
  else {
    local_8 = (ARKRhsFn)0x0;
  }
  return local_8;
}

Assistant:

ARKRhsFn mriStep_GetImplicitRHS(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure, and return fi */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_GetImplicitRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(NULL);
  if (step_mem->implicit_rhs) {
    return(step_mem->fsi);
  } else {
    return(NULL);
  }
}